

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

char * al_fgets(ALLEGRO_FILE *f,char *buf,size_t max)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  bool bVar6;
  uint8_t c;
  uint8_t c_1;
  char local_2a;
  char local_29;
  
  if (max != 0) {
    pcVar4 = buf;
    if (max == 1) {
LAB_00159f9f:
      *pcVar4 = '\0';
      return buf;
    }
    sVar3 = al_fread(f,&local_2a,1);
    if (sVar3 == 1) {
      lVar5 = max - 2;
      pcVar1 = buf + 1;
      do {
        pcVar4 = pcVar1;
        pcVar4[-1] = local_2a;
        bVar6 = lVar5 == 0;
        lVar5 = lVar5 + -1;
        if ((bVar6) || (local_2a == '\n')) goto LAB_00159f9f;
        sVar3 = al_fread(f,&local_29,1);
        local_2a = local_29;
        pcVar1 = pcVar4 + 1;
      } while (sVar3 == 1);
      iVar2 = (*f->vtable->fi_ferror)(f);
      if (iVar2 == 0) goto LAB_00159f9f;
    }
  }
  return (char *)0x0;
}

Assistant:

char *al_fgets(ALLEGRO_FILE *f, char * const buf, size_t max)
{
   char *p = buf;
   int c;
   ASSERT(f);
   ASSERT(buf);

   /* Handle silly cases. */
   if (max == 0) {
      return NULL;
   }
   if (max == 1) {
      *buf = '\0';
      return buf;
   }

   /* Return NULL if already at end of file. */
   if ((c = al_fgetc(f)) == EOF) {
      return NULL;
   }

   /* Fill buffer until empty, or we reach a newline or EOF or error. */
   do {
      *p++ = c;
      max--;
      if (max == 1 || c == '\n')
         break;
      c = al_fgetc(f);
   } while (c != EOF);

   /* Return NULL on error. */
   if (c == EOF && al_ferror(f)) {
      return NULL;
   }

   /* Add null terminator. */
   ASSERT(max >= 1);
   *p = '\0';

   return buf;
}